

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * columnName(sqlite3_stmt *pStmt,int N,int useUtf16,int useType)

{
  int *piVar1;
  byte bVar2;
  long lVar3;
  undefined2 uVar4;
  uint uVar5;
  ulong uVar6;
  u16 *puVar7;
  
  if (N < 0) {
    return (void *)0x0;
  }
  lVar3 = *(long *)pStmt;
  if (*(sqlite3_mutex **)(lVar3 + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar3 + 0x18));
  }
  uVar5 = *(uint *)(pStmt + 200) >> 2 & 3;
  if (uVar5 == 0) {
    if (N < (int)(uint)*(ushort *)(pStmt + 0xc0)) {
      bVar2 = *(byte *)(lVar3 + 0x67);
      puVar7 = (u16 *)sqlite3ValueText((sqlite3_value *)
                                       ((ulong)((uint)*(ushort *)(pStmt + 0xc0) * useType + N) *
                                        0x38 + *(long *)(pStmt + 0x98)),'\x02' - (useUtf16 == 0));
      if (*(byte *)(lVar3 + 0x67) <= bVar2) goto LAB_0012545d;
      if (*(int *)(lVar3 + 0xdc) == 0) {
        *(undefined1 *)(lVar3 + 0x67) = 0;
        *(undefined4 *)(lVar3 + 400) = 0;
        piVar1 = (int *)(lVar3 + 0x198);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          uVar4 = *(undefined2 *)(lVar3 + 0x19e);
        }
        else {
          uVar4 = 0;
        }
        *(undefined2 *)(lVar3 + 0x19c) = uVar4;
      }
    }
  }
  else if ((useType < 1) && (N < (int)((uint)((short)uVar5 == 1) * 4 + 4))) {
    uVar6 = (ulong)((N + uVar5 * 8) - 8);
    if (useUtf16 == 0) {
      puVar7 = (u16 *)(azExplainColNames8_rel + *(int *)(azExplainColNames8_rel + uVar6 * 4));
    }
    else {
      puVar7 = azExplainColNames16data + ""[uVar6];
    }
    goto LAB_0012545d;
  }
  puVar7 = (u16 *)0x0;
LAB_0012545d:
  if (*(sqlite3_mutex **)(lVar3 + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar3 + 0x18));
  }
  return puVar7;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,     /* The statement */
  int N,                   /* Which column to get the name for */
  int useUtf16,            /* True to return the name as UTF16 */
  int useType              /* What type of name */
){
  const void *ret;
  Vdbe *p;
  int n;
  sqlite3 *db;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( N<0 ) return 0;
  ret = 0;
  p = (Vdbe *)pStmt;
  db = p->db;
  assert( db!=0 );
  sqlite3_mutex_enter(db->mutex);

  if( p->explain ){
    if( useType>0 ) goto columnName_end;
    n = p->explain==1 ? 8 : 4;
    if( N>=n ) goto columnName_end;
    if( useUtf16 ){
      int i = iExplainColNames16[N + 8*p->explain - 8];
      ret = (void*)&azExplainColNames16data[i];
    }else{
      ret = (void*)azExplainColNames8[N + 8*p->explain - 8];
    }
    goto columnName_end;
  }
  n = p->nResColumn;
  if( N<n ){
    u8 prior_mallocFailed = db->mallocFailed;
    N += useType*n;
#ifndef SQLITE_OMIT_UTF16
    if( useUtf16 ){
      ret = sqlite3_value_text16((sqlite3_value*)&p->aColName[N]);
    }else
#endif
    {
      ret = sqlite3_value_text((sqlite3_value*)&p->aColName[N]);
    }
    /* A malloc may have failed inside of the _text() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    assert( db->mallocFailed==0 || db->mallocFailed==1 );
    if( db->mallocFailed > prior_mallocFailed ){
      sqlite3OomClear(db);
      ret = 0;
    }
  }
columnName_end:
  sqlite3_mutex_leave(db->mutex);
  return ret;
}